

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_list.cpp
# Opt level: O2

void __thiscall
duckdb::LogicalDependency::LogicalDependency
          (LogicalDependency *this,optional_ptr<duckdb::Catalog,_true> catalog_p,
          CatalogEntryInfo *entry_p,string *catalog_str)

{
  optional_ptr<duckdb::Catalog,_true> local_28;
  
  local_28.ptr = catalog_p.ptr;
  CatalogEntryInfo::CatalogEntryInfo(&this->entry,entry_p);
  ::std::__cxx11::string::string((string *)&this->catalog,(string *)catalog_str);
  if (catalog_p.ptr != (Catalog *)0x0) {
    optional_ptr<duckdb::Catalog,_true>::operator->(&local_28);
    ::std::__cxx11::string::_M_assign((string *)&this->catalog);
  }
  return;
}

Assistant:

LogicalDependency::LogicalDependency(optional_ptr<Catalog> catalog_p, CatalogEntryInfo entry_p, string catalog_str)
    : entry(std::move(entry_p)), catalog(std::move(catalog_str)) {
	if (catalog_p) {
		catalog = catalog_p->GetName();
	}
}